

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestFreeze(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  __type _Var3;
  Template *tpl;
  long lVar4;
  Template *tpl_00;
  string *this;
  allocator local_1e9;
  string pathA;
  string incname;
  string pathB;
  string filename3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string filename1;
  string filename2;
  TemplateCache cache;
  uint7 uStack_b7;
  TemplateString local_a8;
  TemplateDictionary dict;
  
  ctemplate::TemplateCache::TemplateCache(&cache);
  ctemplate::TemplateString::TemplateString((TemplateString *)&filename1,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&filename1,(UnsafeArena *)0x0);
  std::__cxx11::string::string((string *)&filename2,"{valid template}",(allocator *)&pathA);
  ctemplate::StringToTemplateFile(&filename1,&filename2);
  std::__cxx11::string::~string((string *)&filename2);
  std::__cxx11::string::string((string *)&pathA,"hi {{>INC:h}} bar\n",(allocator *)&filename3);
  ctemplate::StringToTemplateFile(&filename2,&pathA);
  std::__cxx11::string::~string((string *)&pathA);
  pathA._M_dataplus = filename1._M_dataplus;
  pathA._M_string_length = filename1._M_string_length;
  pathA.field_2._M_local_buf[0] = '\0';
  pathA.field_2._8_8_ = 0;
  tpl = (Template *)ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)&pathA);
  if (tpl == (Template *)0x0) {
    __assert_fail("cache_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3d7,"static void TemplateCacheUnittest::TestFreeze()");
  }
  std::__cxx11::string::string((string *)&pathA,"{valid template}",(allocator *)&filename3);
  ctemplate::AssertExpandIs(tpl,&dict,&pathA,true);
  std::__cxx11::string::~string((string *)&pathA);
  pathA._M_dataplus = filename2._M_dataplus;
  pathA._M_string_length = filename2._M_string_length;
  pathA.field_2._M_local_buf[0] = '\0';
  pathA.field_2._8_8_ = 0;
  lVar4 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)&pathA);
  if (lVar4 == 0) {
    __assert_fail("cache_tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3da,"static void TemplateCacheUnittest::TestFreeze()");
  }
  std::__cxx11::string::string((string *)&pathA,"hi  bar\n",(allocator *)&filename3);
  ctemplate::AssertExpandWithCacheIs
            (&cache,&filename2,DO_NOT_STRIP,&dict,(PerExpandData *)0x0,&pathA,true);
  std::__cxx11::string::~string((string *)&pathA);
  std::__cxx11::string::string((string *)&filename3,"a/",(allocator *)&incname);
  ctemplate::PathJoin((string *)&pathA,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string((string *)&filename3);
  ctemplate::CreateOrCleanTestDir(&pathA);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)&cache);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var3 = std::operator==(&filename3,&pathA);
  std::__cxx11::string::~string((string *)&filename3);
  if (_Var3) {
    ctemplate::TemplateCache::Freeze();
    std::__cxx11::string::string
              ((string *)&incname,"{yet another valid template}",(allocator *)&pathB);
    ctemplate::StringToTemplateFile(&filename3,&incname);
    std::__cxx11::string::~string((string *)&incname);
    incname._M_dataplus = filename3._M_dataplus;
    incname._M_string_length = filename3._M_string_length;
    incname.field_2._M_local_buf[0] = '\0';
    incname.field_2._8_8_ = 0;
    lVar4 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)&incname);
    if (lVar4 != 0) {
      __assert_fail("!cache_tpl3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3eb,"static void TemplateCacheUnittest::TestFreeze()");
    }
    std::__cxx11::string::string((string *)&incname,"{file1 contents changed}",(allocator *)&pathB);
    ctemplate::StringToFile(&incname,&filename1);
    std::__cxx11::string::~string((string *)&incname);
    ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)&cache);
    incname._M_dataplus = filename1._M_dataplus;
    incname._M_string_length = filename1._M_string_length;
    incname.field_2._M_local_buf[0] = '\0';
    incname.field_2._8_8_ = 0;
    tpl_00 = (Template *)
             ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)&incname);
    if (tpl_00 != tpl) {
      printf("ASSERT FAILED, line %d: %s\n",0x3f3,"cache_tpl1_post_reload == cache_tpl1");
      __assert_fail("cache_tpl1_post_reload == cache_tpl1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3f3,"static void TemplateCacheUnittest::TestFreeze()");
    }
    std::__cxx11::string::string((string *)&incname,"{valid template}",(allocator *)&pathB);
    ctemplate::AssertExpandIs(tpl_00,&dict,&incname,true);
    std::__cxx11::string::~string((string *)&incname);
    incname._M_dataplus = filename1._M_dataplus;
    incname._M_string_length = filename1._M_string_length;
    incname.field_2._M_local_buf[0] = '\0';
    incname.field_2._8_8_ = 0;
    ctemplate::TemplateCache::Delete((TemplateString *)&cache);
    incname._M_dataplus = filename1._M_dataplus;
    incname._M_string_length = filename1._M_string_length;
    incname.field_2._M_local_buf[0] = '\0';
    incname.field_2._8_8_ = 0;
    lVar4 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)&incname);
    if (lVar4 == 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x3f9,"cache.GetTemplate(filename1, STRIP_WHITESPACE)");
      incname._M_dataplus = filename1._M_dataplus;
      incname._M_string_length = filename1._M_string_length;
      incname.field_2._M_local_buf[0] = '\0';
      incname.field_2._8_8_ = 0;
      lVar4 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)&incname);
      if (lVar4 == 0) {
        __assert_fail("cache.GetTemplate(filename1, STRIP_WHITESPACE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x3f9,"static void TemplateCacheUnittest::TestFreeze()");
      }
      goto LAB_0011143e;
    }
    std::__cxx11::string::string((string *)&pathB,"include & print file\n",(allocator *)&local_168);
    ctemplate::StringToTemplateFile(&incname,&pathB);
    std::__cxx11::string::~string((string *)&pathB);
    ctemplate::TemplateString::TemplateString(&local_a8,"INC");
    TVar1.length_ = local_a8.length_;
    TVar1.ptr_ = local_a8.ptr_;
    TVar1.is_immutable_ = local_a8.is_immutable_;
    TVar1._17_7_ = local_a8._17_7_;
    TVar1.id_ = local_a8.id_;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
    TVar2.length_ = incname._M_string_length;
    TVar2.ptr_ = incname._M_dataplus._M_p;
    TVar2._16_8_ = (ulong)uStack_b7 << 8;
    TVar2.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar2);
    std::__cxx11::string::string((string *)&pathB,"hi  bar\n",(allocator *)&local_168);
    ctemplate::AssertExpandWithCacheIs
              (&cache,&filename2,DO_NOT_STRIP,&dict,(PerExpandData *)0x0,&pathB,false);
    std::__cxx11::string::~string((string *)&pathB);
    std::__cxx11::string::string((string *)&local_168,"b/",&local_1e9);
    ctemplate::PathJoin((string *)&pathB,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_168);
    ctemplate::CreateOrCleanTestDir(&pathB);
    ctemplate::TemplateCache::SetTemplateRootDirectory((string *)&cache);
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var3 = std::operator==(&local_168,&pathA);
    std::__cxx11::string::~string((string *)&local_168);
    if (_Var3) {
      ctemplate::CreateOrCleanTestDir(&pathA);
      ctemplate::CreateOrCleanTestDir(&pathB);
      std::__cxx11::string::~string((string *)&pathB);
      std::__cxx11::string::~string((string *)&incname);
      std::__cxx11::string::~string((string *)&filename3);
      std::__cxx11::string::~string((string *)&pathA);
      std::__cxx11::string::~string((string *)&filename2);
      std::__cxx11::string::~string((string *)&filename1);
      ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
      ctemplate::TemplateCache::~TemplateCache(&cache);
      return;
    }
    printf("ASSERT FAILED, line %d: %s\n",0x405,"cache.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var3 = std::operator==(&local_168,&pathA);
    if (!_Var3) {
      __assert_fail("cache.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x405,"static void TemplateCacheUnittest::TestFreeze()");
    }
    this = &local_168;
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x3e3,"cache.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var3 = std::operator==(&filename3,&pathA);
    if (!_Var3) {
      __assert_fail("cache.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3e3,"static void TemplateCacheUnittest::TestFreeze()");
    }
    this = &filename3;
  }
  std::__cxx11::string::~string((string *)this);
LAB_0011143e:
  exit(1);
}

Assistant:

static void TestFreeze() {
    TemplateCache cache;
     TemplateDictionary dict("dict");

    // Load some templates
    string filename1 = StringToTemplateFile("{valid template}");
    string filename2 = StringToTemplateFile("hi {{>INC:h}} bar\n");

    const Template* cache_tpl1 = cache.GetTemplate(filename1, STRIP_WHITESPACE);
    assert(cache_tpl1);
    AssertExpandIs(cache_tpl1, &dict, "{valid template}", true);
    const Template* cache_tpl2 = cache.GetTemplate(filename2, DO_NOT_STRIP);
    assert(cache_tpl2);
    static_cast<void>(cache_tpl2);  // avoid unused var warning in opt mode
    AssertExpandWithCacheIs(&cache, filename2, DO_NOT_STRIP, &dict, NULL,
                            "hi  bar\n", true);

    // Set the root directory
    const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
    CreateOrCleanTestDir(pathA);
    cache.SetTemplateRootDirectory(pathA);
    ASSERT(cache.template_root_directory() == pathA);

    // Freeze the cache now, and test its impact.
    cache.Freeze();

    // 1. Loading new templates fails.
    string filename3 = StringToTemplateFile("{yet another valid template}");
    const Template* cache_tpl3 = cache.GetTemplate(filename3, STRIP_WHITESPACE);
    assert(!cache_tpl3);
    static_cast<void>(cache_tpl3);  // avoid unused var warning in opt mode

    // 2. Reloading existing templates fails.
    StringToFile("{file1 contents changed}", filename1);
    cache.ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    const Template* cache_tpl1_post_reload = cache.GetTemplate(
        filename1, STRIP_WHITESPACE);
    ASSERT(cache_tpl1_post_reload == cache_tpl1);
    // Check that cache's tpl1 has the same old contents
    AssertExpandIs(cache_tpl1_post_reload, &dict, "{valid template}",
                   true);
    // 3. Cannot delete from a frozen cache.
    cache.Delete(filename1);
    ASSERT(cache.GetTemplate(filename1, STRIP_WHITESPACE));

    // 4. Expand won't load an included template on-demand.
    string incname = StringToTemplateFile("include & print file\n");
    dict.AddIncludeDictionary("INC")->SetFilename(incname);
    AssertExpandWithCacheIs(&cache, filename2, DO_NOT_STRIP, &dict, NULL,
                            "hi  bar\n", false);

    // 5. Cannot change template root directory.
    const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
    CreateOrCleanTestDir(pathB);
    cache.SetTemplateRootDirectory(pathB);
    ASSERT(cache.template_root_directory() == pathA);  // Still the old path

    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);
  }